

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  ulong *seqStart;
  byte bVar1;
  byte bVar2;
  BYTE BVar3;
  seq_t sequence;
  bool bVar4;
  ZSTD_seqSymbol *pZVar5;
  ZSTD_DCtx *pZVar6;
  uint uVar7;
  BYTE *op_2;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  BYTE *pBVar11;
  byte bVar12;
  BYTE *pBVar13;
  ulong uVar14;
  BYTE *pBVar15;
  BYTE *oend;
  ulong uVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *oend_00;
  void *src_00;
  size_t __n;
  ulong uVar19;
  int iVar20;
  BYTE *ip_1;
  BYTE *pBVar21;
  ulong uVar22;
  int nbSeq;
  BYTE *ostart;
  BYTE *litPtr;
  ZSTD_longOffset_e in_stack_fffffffffffffe78;
  int local_154;
  BYTE *local_150;
  BYTE *local_148;
  BYTE *local_140;
  ulong local_138;
  ZSTD_DCtx *local_130;
  BYTE *local_128;
  BYTE *local_120;
  BIT_DStream_t local_118;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ulong local_c0 [7];
  BYTE *local_88;
  int local_7c;
  BYTE *local_78;
  ulong *local_70;
  BYTE *local_68;
  size_t local_60;
  BYTE *local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar8 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  src_00 = (void *)((long)src + sVar8);
  sVar8 = srcSize - sVar8;
  local_148 = (BYTE *)dst;
  local_130 = dctx;
  sVar9 = ZSTD_decodeSeqHeaders(dctx,&local_154,src_00,sVar8);
  pZVar6 = local_130;
  pBVar13 = local_148;
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  seqStart = (ulong *)((long)src_00 + sVar9);
  uVar22 = sVar8 - sVar9;
  if (((frame == 0) || (0x1000000 < (local_130->fParams).windowSize)) && (0 < local_154)) {
    iVar20 = 0;
    uVar7 = 1;
    do {
      iVar20 = (iVar20 + 1) -
               (uint)(local_130->OFTptr[(ulong)(uVar7 - 1) + 1].nbAdditionalBits < 0x17);
      bVar12 = (byte)local_130->OFTptr->baseValue;
      uVar18 = uVar7 >> (bVar12 & 0x1f);
      uVar7 = uVar7 + 1;
    } while (uVar18 == 0);
    if (6 < (uint)(iVar20 << (8 - bVar12 & 0x1f))) {
      sVar8 = ZSTD_decompressSequencesLong
                        (local_130,local_148,dstCapacity,seqStart,uVar22,local_154,
                         in_stack_fffffffffffffe78);
      return sVar8;
    }
  }
  if (local_130->bmi2 != 0) {
    sVar8 = ZSTD_decompressSequences_bmi2
                      (local_130,local_148,dstCapacity,seqStart,uVar22,local_154,
                       in_stack_fffffffffffffe78);
    return sVar8;
  }
  oend_00 = local_148 + dstCapacity;
  local_120 = local_130->litPtr;
  local_88 = local_120 + local_130->litSize;
  pBVar21 = local_148;
  if (local_154 == 0) goto LAB_0015c304;
  pBVar11 = (BYTE *)local_130->base;
  local_68 = (BYTE *)local_130->vBase;
  pBVar17 = (BYTE *)local_130->dictEnd;
  local_130->fseEntropy = 1;
  lVar10 = -0xc;
  do {
    *(ulong *)((long)local_c0 + lVar10 * 2 + 0x18) =
         (ulong)*(uint *)((long)&local_130->previousDstEnd + lVar10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0);
  if (sVar8 == sVar9) {
    local_118.ptr = (char *)0x0;
    local_118.start = (char *)0x0;
    local_118.bitContainer = 0;
    local_118.bitsConsumed = 0;
    local_118._12_4_ = 0;
    local_118.limitPtr = (char *)0x0;
LAB_0015c2f4:
    bVar4 = false;
    uVar14 = 0xffffffffffffffec;
  }
  else {
    local_118.limitPtr = (char *)(seqStart + 1);
    local_118.start = (char *)seqStart;
    if (uVar22 < 8) {
      local_118.bitContainer = (size_t)(byte)*seqStart;
      switch(uVar22) {
      case 7:
        local_118.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_118.bitContainer;
      case 6:
        local_118.bitContainer =
             local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_118.bitContainer =
             local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar12 = *(byte *)((long)src_00 + (sVar8 - 1));
      uVar7 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      local_118.bitsConsumed = ~uVar7 + 9;
      if (bVar12 == 0) {
        local_118.bitsConsumed = 0;
      }
      local_118.ptr = (char *)seqStart;
      if (bVar12 == 0) goto LAB_0015c2f4;
      local_118.bitsConsumed = local_118.bitsConsumed + (int)uVar22 * -8 + 0x40;
LAB_0015c472:
      local_140 = pBVar11;
      local_78 = pBVar17;
      ZSTD_initFseState(&local_f0,&local_118,local_130->LLTptr);
      ZSTD_initFseState(&local_e0,&local_118,pZVar6->OFTptr);
      ZSTD_initFseState(&local_d0,&local_118,pZVar6->MLTptr);
      local_128 = oend_00 + -8;
      local_58 = oend_00 + -0xd;
      local_60 = 0xffffffffffffffec;
      pBVar21 = pBVar13;
      do {
        uVar22 = local_c0[1];
        uVar7 = local_118.bitsConsumed;
        if (local_118.bitsConsumed < 0x41) {
          if (local_118.ptr < local_118.limitPtr) {
            if (local_118.ptr == local_118.start) goto LAB_0015c56d;
            uVar14 = (ulong)(uint)((int)local_118.ptr - (int)local_118.start);
            if (local_118.start <=
                (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
              uVar14 = (ulong)(local_118.bitsConsumed >> 3);
            }
            uVar18 = local_118.bitsConsumed + (int)uVar14 * -8;
          }
          else {
            uVar14 = (ulong)(local_118.bitsConsumed >> 3);
            uVar18 = local_118.bitsConsumed & 7;
          }
          local_118.ptr = (char *)((long)local_118.ptr - uVar14);
          local_118.bitsConsumed = uVar18;
          local_118.bitContainer = *(size_t *)local_118.ptr;
        }
LAB_0015c56d:
        local_150 = pBVar13;
        if ((0x40 < uVar7) || (local_154 == 0)) {
          if (local_154 == 0) {
            lVar10 = 0;
            do {
              (local_130->entropy).rep[lVar10] = (U32)local_c0[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            bVar4 = true;
            uVar14 = local_60;
          }
          else {
            bVar4 = false;
            uVar14 = 0xffffffffffffffec;
          }
          break;
        }
        bVar12 = local_f0.table[local_f0.state].nbAdditionalBits;
        bVar1 = local_d0.table[local_d0.state].nbAdditionalBits;
        bVar2 = local_e0.table[local_e0.state].nbAdditionalBits;
        uVar19 = (ulong)local_d0.table[local_d0.state].baseValue;
        if (bVar2 == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = ((local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >>
                   (-bVar2 & 0x3f)) + (ulong)local_e0.table[local_e0.state].baseValue;
          local_118.bitsConsumed = local_118.bitsConsumed + bVar2;
        }
        local_7c = local_154 + -1;
        if (bVar2 < 2) {
          lVar10 = uVar14 + ((ulong)local_f0.table[local_f0.state].baseValue == 0);
          if (lVar10 != 0) {
            if (lVar10 == 3) {
              uVar22 = local_c0[0] - 1;
            }
            else {
              uVar22 = local_c0[lVar10];
            }
            if (lVar10 != 1) {
              local_c0[2] = local_c0[1];
            }
            local_c0[1] = local_c0[0];
            local_c0[0] = uVar22 + (uVar22 == 0);
          }
        }
        else {
          local_c0[1] = local_c0[0];
          local_c0[2] = uVar22;
          local_c0[0] = uVar14;
        }
        uVar22 = local_c0[0];
        if (bVar1 == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
          local_118.bitsConsumed = local_118.bitsConsumed + bVar1;
        }
        if ((0x1e < (uint)bVar1 + (uint)bVar12 + (uint)bVar2) && (local_118.bitsConsumed < 0x41)) {
          if (local_118.ptr < local_118.limitPtr) {
            if (local_118.ptr == local_118.start) goto LAB_0015c755;
            local_70 = (ulong *)local_118.start;
            uVar16 = (ulong)(uint)((int)local_118.ptr - (int)local_118.start);
            if (local_118.start <=
                (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
              uVar16 = (ulong)(local_118.bitsConsumed >> 3);
            }
            uVar7 = local_118.bitsConsumed + (int)uVar16 * -8;
          }
          else {
            uVar16 = (ulong)(local_118.bitsConsumed >> 3);
            uVar7 = local_118.bitsConsumed & 7;
          }
          local_118.ptr = (char *)((long)local_118.ptr - uVar16);
          local_118.bitsConsumed = uVar7;
          local_118.bitContainer = *(size_t *)local_118.ptr;
        }
LAB_0015c755:
        if (bVar12 == 0) {
          local_50 = 0;
        }
        else {
          local_50 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >>
                     (-bVar12 & 0x3f);
          local_118.bitsConsumed = local_118.bitsConsumed + bVar12;
        }
        __n = uVar19 + uVar14;
        pZVar5 = local_f0.table + local_f0.state;
        local_50 = local_50 + local_f0.table[local_f0.state].baseValue;
        local_f0.state =
             (((local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> 1) >>
             (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_f0.table[local_f0.state].nextState;
        iVar20 = local_118.bitsConsumed + pZVar5->nbBits;
        pZVar5 = local_d0.table + local_d0.state;
        local_d0.state =
             (((local_118.bitContainer << ((byte)iVar20 & 0x3f)) >> 1) >>
             (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_d0.table[local_d0.state].nextState;
        iVar20 = iVar20 + (uint)pZVar5->nbBits;
        pZVar5 = local_e0.table + local_e0.state;
        local_e0.state =
             (((local_118.bitContainer << ((byte)iVar20 & 0x3f)) >> 1) >>
             (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_e0.table[local_e0.state].nextState;
        local_118._12_4_ = local_118._12_4_;
        local_118.bitsConsumed = iVar20 + (uint)pZVar5->nbBits;
        sStack_48 = __n;
        local_40 = local_c0[0];
        local_138 = __n + local_50;
        pBVar21 = pBVar13 + local_138;
        uVar14 = 0xffffffffffffffba;
        if (pBVar21 <= oend_00) {
          pBVar11 = local_120 + local_50;
          uVar14 = 0xffffffffffffffec;
          if (pBVar11 <= local_88) {
            pBVar17 = pBVar13 + local_50;
            if (local_128 < pBVar17) {
              sequence.matchLength = __n;
              sequence.litLength = local_50;
              sequence.offset = local_c0[0];
              sequence.match = pBStack_38;
              local_138 = uVar19;
              uVar14 = ZSTD_execSequenceLast7
                                 (pBVar13,oend_00,sequence,&local_120,local_88,local_140,local_68,
                                  local_78);
              uVar19 = local_138;
            }
            else {
              *(undefined8 *)pBVar13 = *(undefined8 *)local_120;
              if (8 < local_50) {
                pBVar13 = pBVar13 + 8;
                do {
                  local_120 = local_120 + 8;
                  *(undefined8 *)pBVar13 = *(undefined8 *)local_120;
                  pBVar13 = pBVar13 + 8;
                } while (pBVar13 < pBVar17);
              }
              uVar14 = local_138;
              pBVar13 = pBVar17 + -local_c0[0];
              local_120 = pBVar11;
              if ((ulong)((long)pBVar17 - (long)local_140) < local_c0[0]) {
                uVar14 = 0xffffffffffffffec;
                if (local_c0[0] <= (ulong)((long)pBVar17 - (long)local_68)) {
                  lVar10 = (long)(pBVar17 + -local_c0[0]) - (long)local_140;
                  pBVar13 = local_78 + lVar10;
                  if (local_78 < pBVar13 + __n) {
                    memmove(pBVar17,pBVar13,-lVar10);
                    pBVar17 = pBVar17 + -lVar10;
                    sStack_48 = __n + lVar10;
                    uVar14 = local_138;
                    uVar19 = local_138;
                    if ((pBVar17 <= local_128) && (pBVar13 = local_140, 2 < sStack_48))
                    goto LAB_0015c98a;
                    if (sStack_48 != 0) {
                      uVar22 = 0;
                      do {
                        pBVar17[uVar22] = local_140[uVar22];
                        uVar22 = uVar22 + 1;
                      } while ((uVar22 & 0xffffffff) < sStack_48);
                    }
                  }
                  else {
                    memmove(pBVar17,pBVar13,__n);
                    uVar14 = local_138;
                    uVar19 = local_138;
                  }
                }
              }
              else {
LAB_0015c98a:
                local_138 = uVar19;
                if (uVar22 < 8) {
                  iVar20 = *(int *)(ZSTD_execSequence_dec64table + uVar22 * 4);
                  *pBVar17 = *pBVar13;
                  pBVar17[1] = pBVar13[1];
                  pBVar17[2] = pBVar13[2];
                  pBVar17[3] = pBVar13[3];
                  pBVar11 = pBVar13 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
                  pBVar13 = pBVar13 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_40 * 4)
                                      - (long)iVar20);
                  *(undefined4 *)(pBVar17 + 4) = *(undefined4 *)pBVar11;
                }
                else {
                  *(undefined8 *)pBVar17 = *(undefined8 *)pBVar13;
                }
                pBVar11 = pBVar17 + 8;
                pBVar13 = pBVar13 + 8;
                uVar19 = local_138;
                if (local_58 < pBVar21) {
                  pBVar17 = pBVar11;
                  pBVar15 = pBVar13;
                  if (pBVar11 < local_128) {
                    do {
                      *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                      pBVar17 = pBVar17 + 8;
                      pBVar15 = pBVar15 + 8;
                    } while (pBVar17 < local_128);
                    pBVar13 = pBVar13 + ((long)local_128 - (long)pBVar11);
                    pBVar11 = local_128;
                  }
                  for (; pBVar11 < pBVar21; pBVar11 = pBVar11 + 1) {
                    BVar3 = *pBVar13;
                    pBVar13 = pBVar13 + 1;
                    *pBVar11 = BVar3;
                  }
                }
                else {
                  do {
                    *(undefined8 *)pBVar11 = *(undefined8 *)pBVar13;
                    pBVar11 = pBVar11 + 8;
                    pBVar13 = pBVar13 + 8;
                  } while (pBVar11 < pBVar17 + sStack_48);
                }
              }
            }
          }
        }
        local_138 = uVar19;
        bVar4 = false;
        uVar22 = 0;
        if (uVar14 < 0xffffffffffffff89) {
          uVar22 = uVar14;
        }
        pBVar13 = local_150 + uVar22;
        pBVar21 = local_148;
        local_154 = local_7c;
      } while (uVar14 < 0xffffffffffffff89);
    }
    else {
      local_118.ptr = (char *)((long)src_00 + (sVar8 - 8));
      local_118.bitContainer = *(size_t *)local_118.ptr;
      bVar12 = *(byte *)((long)src_00 + (sVar8 - 1));
      uVar7 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      local_118.bitsConsumed = ~uVar7 + 9;
      if (bVar12 == 0) {
        local_118.bitsConsumed = 0;
      }
      bVar4 = false;
      uVar14 = 0xffffffffffffffec;
      if (0xffffffffffffff88 < uVar22) goto LAB_0015c2f4;
      if (bVar12 != 0) goto LAB_0015c472;
    }
  }
  if (!bVar4) {
    return uVar14;
  }
LAB_0015c304:
  uVar22 = (long)local_88 - (long)local_120;
  if ((ulong)((long)oend_00 - (long)pBVar13) < uVar22) {
    pBVar13 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(pBVar13,local_120,uVar22);
    pBVar13 = pBVar13 + (uVar22 - (long)pBVar21);
  }
  return (size_t)pBVar13;
}

Assistant:

static size_t ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative. (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN)));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {   int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        if ( (!frame || dctx->fParams.windowSize > (1<<24))
          && (nbSeq>0) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            if (shareLongOffsets >= minShare)
                return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
        }

        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
    }
}